

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O1

integer_t * __thiscall tchecker::vm_t::slot_of(vm_t *this,bytecode_t id)

{
  _Rb_tree_header *p_Var1;
  pointer pmVar2;
  pointer pmVar3;
  _Base_ptr *in_RAX;
  _Base_ptr *pp_Var4;
  out_of_range *this_00;
  pointer pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  
  pmVar2 = (this->_frames).
           super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar3 = (this->_frames).
           super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pmVar5 = pmVar3;
    pp_Var4 = in_RAX;
    if (pmVar5 == pmVar2) break;
    p_Var1 = &pmVar5[-1]._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = pmVar5[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(long *)(p_Var7 + 1) < id]) {
      if (id <= *(long *)(p_Var7 + 1)) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var7 = p_Var6, id < *(long *)(p_Var6 + 1))) {
      p_Var7 = &p_Var1->_M_header;
    }
    pp_Var4 = &p_Var7[1]._M_parent;
    pmVar3 = pmVar5 + -1;
  } while ((_Rb_tree_header *)p_Var7 == p_Var1);
  if (pmVar5 == pmVar2) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"unknown local variable ID");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  return (integer_t *)pp_Var4;
}

Assistant:

tchecker::integer_t & slot_of(tchecker::bytecode_t id)
  {
    for (auto it = _frames.rbegin(); it != _frames.rend(); ++it) {
      auto kv = it->find(id);
      if (kv != it->end())
        return kv->second;
    }
    throw std::out_of_range("unknown local variable ID");
  }